

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Add
          (PersistentStorageJson *this,Domain *aValue,DomainId *aRetId)

{
  Status SVar1;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)JSON_DOM_SEQ_abi_cxx11_);
  std::__cxx11::string::string((string *)&sStack_58,(string *)JSON_DOM_abi_cxx11_);
  SVar1 = AddOne<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>
                    (this,aValue,aRetId,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Add(Domain const &aValue, DomainId &aRetId)
{
    return AddOne<Domain, DomainId>(aValue, aRetId, JSON_DOM_SEQ, JSON_DOM);
}